

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall
Component_containsEncapsulatedComponent_Test::TestBody
          (Component_containsEncapsulatedComponent_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  allocator<char> local_e0 [8];
  AssertHelper local_d8 [8];
  char *local_d0 [4];
  ComponentPtr c1;
  ComponentPtr c4;
  ComponentPtr c2;
  ModelPtr m;
  AssertionResult gtest_ar_;
  ComponentPtr c6;
  ComponentPtr c5;
  ComponentPtr c;
  ComponentPtr c3;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"",(allocator<char> *)&c1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"",(allocator<char> *)&c2);
  createModelWithComponent((string *)&m,(string *)local_d0);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)local_d0);
  libcellml::ComponentEntity::component((ulong)&c);
  peVar2 = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child0",(allocator<char> *)&c1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child1",(allocator<char> *)&c2);
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child2",(allocator<char> *)&c3);
  libcellml::Component::create((string *)&c2);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child3",(allocator<char> *)&c4);
  libcellml::Component::create((string *)&c3);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child4",(allocator<char> *)&c5);
  libcellml::Component::create((string *)&c4);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child5",(allocator<char> *)&c6);
  libcellml::Component::create((string *)&c5);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"child6",(allocator<char> *)&gtest_ar_);
  libcellml::Component::create((string *)&c6);
  std::__cxx11::string::~string((string *)local_d0);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"child4",local_e0);
  bVar3 = libcellml::ComponentEntity::containsComponent((string *)peVar1,SUB81(local_d0,0));
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_d0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_d0,&gtest_ar_.success_,
               "m->containsComponent(\"child4\", false)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0xae,local_d0[0]);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    std::__cxx11::string::~string((string *)local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::ComponentEntity::containsComponent
                       ((shared_ptr *)
                        m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        SUB81(&c4,0));
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_d0,&gtest_ar_.success_,"m->containsComponent(c4, true)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0xaf,local_d0[0]);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    std::__cxx11::string::~string((string *)local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Component, containsEncapsulatedComponent)
{
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    c->setName("child0");
    libcellml::ComponentPtr c1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr c2 = libcellml::Component::create("child2");
    libcellml::ComponentPtr c3 = libcellml::Component::create("child3");
    libcellml::ComponentPtr c4 = libcellml::Component::create("child4");
    libcellml::ComponentPtr c5 = libcellml::Component::create("child5");
    libcellml::ComponentPtr c6 = libcellml::Component::create("child6");

    c->addComponent(c1);
    c->addComponent(c2);
    c1->addComponent(c4);
    c1->addComponent(c5);
    c1->addComponent(c6);

    EXPECT_FALSE(m->containsComponent("child4", false));
    EXPECT_TRUE(m->containsComponent(c4, true));
}